

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

ptrlen BinarySource_get_string(BinarySource *src)

{
  _Bool _Var1;
  uint32_t uVar2;
  ulong wanted;
  size_t sVar3;
  size_t len;
  uchar *ucp;
  BinarySource *src_local;
  
  _Var1 = BinarySource_data_avail(src,4);
  if (_Var1) {
    sVar3 = src->pos;
    src->pos = sVar3 + 4;
    uVar2 = GET_32BIT_MSB_FIRST((void *)((long)src->data + sVar3));
    wanted = (ulong)uVar2;
    _Var1 = BinarySource_data_avail(src,wanted);
    if (_Var1) {
      sVar3 = wanted + src->pos;
      src->pos = sVar3;
      _src_local = make_ptrlen((void *)((long)src->data + (sVar3 - wanted)),wanted);
    }
    else {
      _src_local = make_ptrlen("",0);
    }
  }
  else {
    _src_local = make_ptrlen("",0);
  }
  return _src_local;
}

Assistant:

ptrlen BinarySource_get_string(BinarySource *src)
{
    const unsigned char *ucp;
    size_t len;

    if (!avail(4))
        return make_ptrlen("", 0);

    ucp = consume(4);
    len = GET_32BIT_MSB_FIRST(ucp);

    if (!avail(len))
        return make_ptrlen("", 0);

    return make_ptrlen(consume(len), len);
}